

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_ssb_sw.c
# Opt level: O3

void ssb_set_ext_params(xc_func_type *p,double *ext_params)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double tmp_kt [2];
  double tmp_ssb [5];
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  
  dVar1 = get_ext_param(p,ext_params,0);
  dVar2 = get_ext_param(p,ext_params,1);
  dVar3 = get_ext_param(p,ext_params,2);
  dVar4 = get_ext_param(p,ext_params,3);
  dVar5 = get_ext_param(p,ext_params,4);
  dVar6 = get_ext_param(p,ext_params,5);
  dVar7 = get_ext_param(p,ext_params,6);
  local_40 = get_ext_param(p,ext_params,7);
  local_20 = (1.0 - dVar7) * dVar4;
  local_48 = dVar6 * dVar7 * dVar2 * 0.01645530784602056 * 0.9305257363491001;
  local_38 = dVar1;
  local_30 = dVar2;
  local_28 = dVar3;
  local_18 = dVar5;
  xc_func_set_ext_params(p->func_aux[1],&local_38);
  xc_func_set_ext_params(p->func_aux[2],&local_48);
  return;
}

Assistant:

static void
ssb_set_ext_params(xc_func_type *p, const double *ext_params) {
  double A, B, C, D, E, F, u, delta;
  double tmp_ssb[5];
  double tmp_kt[2];

  /* Get the parameters */
  A = get_ext_param(p, ext_params, 0);
  B = get_ext_param(p, ext_params, 1);
  C = get_ext_param(p, ext_params, 2);
  D = get_ext_param(p, ext_params, 3);
  E = get_ext_param(p, ext_params, 4);
  F = get_ext_param(p, ext_params, 5);
  u = get_ext_param(p, ext_params, 6);
  delta = get_ext_param(p, ext_params, 7);

  /* Calculate the parameters for SSB-SW and KT1 */
  tmp_ssb[0] = A;
  tmp_ssb[1] = B;
  tmp_ssb[2] = C;
  tmp_ssb[3] = D * (1.0-u);
  tmp_ssb[4] = E;
  /* Swart et al define KT in terms of s^2 not x^2  */
  tmp_kt[0] = u * F * B * (X2S*X2S) * X_FACTOR_C;
  tmp_kt[1] = delta;

  /* Set the SSB and KT parameters */
  xc_func_set_ext_params(p->func_aux[1], tmp_ssb);
  xc_func_set_ext_params(p->func_aux[2], tmp_kt);
}